

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.cpp
# Opt level: O1

void * PathfinderDVLThread(void *pParam)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  CHRONO chrono_period;
  char szTemp [256];
  PATHFINDERDVL pathfinderdvl;
  NMEADATA nmeadata;
  char szSaveFilePath [256];
  double local_c68;
  double local_c60;
  interval local_c58;
  int local_c40;
  int local_c3c;
  interval local_c38;
  interval local_c20;
  timespec local_c08;
  double local_bf8;
  double dStack_bf0;
  double local_be8;
  double dStack_be0;
  timespec local_bd8;
  int local_bc8;
  double local_bc0;
  char local_bb8 [264];
  PATHFINDERDVL local_ab0;
  NMEADATA local_510;
  char local_138 [264];
  
  memset(&local_ab0,0,0x5a0);
  memset(&local_510,0,0x3d8);
  iVar4 = clock_getres(4,&local_bd8);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_c08), iVar4 == 0)) {
    local_bc8 = 0;
    local_bf8 = 0.0;
    dStack_bf0 = 0.0;
    local_be8 = 0.0;
    dStack_be0 = 0.0;
  }
  local_c40 = 100;
  bVar2 = false;
  local_c3c = 0;
  do {
    while( true ) {
      if (local_bc8 == 0) {
        clock_gettime(4,(timespec *)&local_c58);
        local_bf8 = local_c58.inf;
        dStack_bf0 = local_c58.sup;
        local_c58.inf =
             (double)(((long)local_c58.inf + (long)local_be8 +
                      ((long)local_c58.sup + (long)dStack_be0) / 1000000000) - local_c08.tv_sec);
        local_c58.sup =
             (double)(((long)local_c58.sup + (long)dStack_be0) % 1000000000 - local_c08.tv_nsec);
        if ((long)local_c58.sup < 0) {
          local_c58.inf = (double)((long)local_c58.inf + (long)local_c58.sup / 1000000000 + -1);
          local_c58.sup = (double)((long)local_c58.sup % 1000000000 + 1000000000);
        }
        local_be8 = local_c58.inf;
        dStack_be0 = local_c58.sup;
      }
      iVar4 = clock_getres(4,&local_bd8);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_c08), iVar4 == 0)) {
        local_bc8 = 0;
        local_be8 = 0.0;
        dStack_be0 = 0.0;
        local_bf8 = 0.0;
        dStack_bf0 = 0.0;
      }
      if (bPausePathfinderDVL == 0) break;
      if (bVar2) {
        puts("PathfinderDVL paused.");
        DisconnectPathfinderDVL(&local_ab0);
      }
      if (bExit != 0) {
        bVar3 = true;
        goto LAB_001ae997;
      }
      local_c58.inf = 0.0;
      local_c58.sup = 4.94065645841247e-316;
      bVar2 = false;
      nanosleep((timespec *)&local_c58,(timespec *)0x0);
    }
    if (bRestartPathfinderDVL != 0) {
      if (bVar2) {
        puts("Restarting a PathfinderDVL.");
        DisconnectPathfinderDVL(&local_ab0);
      }
      bRestartPathfinderDVL = 0;
      bVar2 = false;
    }
    if (bVar2) {
      iVar4 = GetNMEASentencePathfinderDVL(&local_ab0,&local_510);
      if (iVar4 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        if (((((local_ab0.bEnable_PD6_SA != 0) || (local_ab0.bEnable_PD6_TS != 0)) ||
             (local_ab0.bEnable_PD6_BI != 0)) ||
            ((local_ab0.bEnable_PD6_BS != 0 || (local_ab0.bEnable_PD6_BE != 0)))) ||
           (local_ab0.bEnable_PD6_BD != 0)) {
          if (local_ab0.bEnable_PD6_SA != 0) {
            dVar1 = fmod((1.5707963267948966 - local_510.Heading) - angle_env,6.283185307179586);
            local_c68 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
            local_c68 = local_c68 + -3.141592653589793;
            interval::interval(&local_c38,&local_c68);
            local_c60 = -psi_ahrs_acc;
            interval::interval(&local_c20,&local_c60,&psi_ahrs_acc);
            operator+(&local_c38,&local_c20);
            interval::operator=((interval *)&psi_ahrs,&local_c58);
            local_c68 = -local_510.Pitch;
            interval::interval(&local_c38,&local_c68);
            local_c60 = -theta_ahrs_acc;
            interval::interval(&local_c20,&local_c60,&theta_ahrs_acc);
            operator+(&local_c38,&local_c20);
            interval::operator=((interval *)&theta_ahrs,&local_c58);
            interval::interval(&local_c38,&local_510.Roll);
            local_c68 = -phi_ahrs_acc;
            interval::interval(&local_c20,&local_c68,&phi_ahrs_acc);
            operator+(&local_c38,&local_c20);
            interval::operator=((interval *)&phi_ahrs,&local_c58);
          }
          if (local_ab0.bEnable_PD6_BS != 0) {
            if (local_510.vstatus_ship == 'V') {
              local_c38.inf = -10000.0;
              local_c20.inf = 10000.0;
              interval::interval(&local_c58,&local_c38.inf,&local_c20.inf);
              interval::operator=((interval *)&vrx_dvl,&local_c58);
              local_c38.inf = -10000.0;
              local_c20.inf = 10000.0;
              interval::interval(&local_c58,&local_c38.inf,&local_c20.inf);
              interval::operator=((interval *)&vry_dvl,&local_c58);
              local_c38.inf = -10000.0;
              local_c20.inf = 10000.0;
              interval::interval(&local_c58,&local_c38.inf,&local_c20.inf);
            }
            else {
              if (local_510.vstatus_ship != 'A') goto LAB_001ae826;
              interval::interval(&local_c38,&local_510.vl_ship);
              local_c68 = -dvl_acc;
              interval::interval(&local_c20,&local_c68,&dvl_acc);
              operator+(&local_c38,&local_c20);
              interval::operator=((interval *)&vrx_dvl,&local_c58);
              local_c68 = -local_510.vt_ship;
              interval::interval(&local_c38,&local_c68);
              local_c60 = -dvl_acc;
              interval::interval(&local_c20,&local_c60,&dvl_acc);
              operator+(&local_c38,&local_c20);
              interval::operator=((interval *)&vry_dvl,&local_c58);
              interval::interval(&local_c38,&local_510.vn_ship);
              local_c68 = -dvl_acc;
              interval::interval(&local_c20,&local_c68,&dvl_acc);
              operator+(&local_c38,&local_c20);
            }
            interval::operator=((interval *)&vrz_dvl,&local_c58);
          }
LAB_001ae826:
          if ((local_ab0.bEnable_PD6_BE != 0) && (local_510.vstatus_earth == 'A')) {
            sog = local_510.SOG;
            dVar1 = fmod((1.5707963267948966 - local_510.COG) - angle_env,6.283185307179586);
            local_c68 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
            local_c68 = local_c68 + -3.141592653589793;
            interval::interval(&local_c38,&local_c68);
            local_c60 = -3.141592653589793;
            local_bc0 = 3.141592653589793;
            interval::interval(&local_c20,&local_c60,&local_bc0);
            operator+(&local_c38,&local_c20);
            interval::operator=((interval *)&psi_dvl,&local_c58);
          }
          if ((local_ab0.bEnable_PD6_BD != 0) && (local_510.timesincelastgood < 4.0)) {
            altitude_AGL = local_510.Altitude_AGL;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        bVar2 = true;
        bVar3 = false;
      }
      else {
        puts("Connection to a PathfinderDVL lost.");
        DisconnectPathfinderDVL(&local_ab0);
        local_c58.inf = (double)((long)local_c40 / 1000);
        local_c58.sup = (double)(((long)local_c40 % 1000) * 1000000);
LAB_001ae2f9:
        bVar2 = false;
        nanosleep((timespec *)&local_c58,(timespec *)0x0);
        bVar3 = true;
      }
    }
    else {
      iVar4 = ConnectPathfinderDVL(&local_ab0,"PathfinderDVL0.txt");
      if (iVar4 != 0) {
        local_c58.inf = 4.94065645841247e-324;
        local_c58.sup = 0.0;
        goto LAB_001ae2f9;
      }
      local_c40 = local_ab0.threadperiod;
      memset(&local_510,0,0x3d8);
      if ((FILE *)local_ab0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_ab0.pfSaveFile);
        local_ab0.pfSaveFile = (FILE *)0x0;
      }
      bVar3 = false;
      bVar2 = true;
      if ((local_ab0.bSaveRawData != 0) && ((FILE *)local_ab0.pfSaveFile == (FILE *)0x0)) {
        if (local_ab0.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_bb8 + 8,"erdvl",6);
          builtin_strncpy(local_bb8,"pathfind",8);
        }
        else {
          sprintf(local_bb8,"%.127s",local_ab0.szCfgFilePath);
        }
        sVar6 = strlen(local_bb8);
        uVar5 = (uint)sVar6;
        uVar12 = sVar6 & 0xffffffff;
        uVar8 = (int)uVar5 >> 0x1f & uVar5;
        uVar11 = sVar6 & 0xffffffff;
        do {
          uVar12 = uVar12 - 1;
          uVar10 = (uint)uVar11;
          uVar11 = (ulong)(uVar8 - 1);
          uVar9 = uVar8;
          if ((int)uVar10 < 1) break;
          uVar11 = (ulong)(uVar10 - 1);
          uVar9 = uVar10;
        } while (local_bb8[uVar12 & 0xffffffff] != '.');
        if ((int)uVar9 <= (int)uVar5 && 1 < (int)uVar9) {
          memset(local_bb8 + uVar11,0,sVar6 - uVar11);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar7 = strtimeex_fns();
        bVar3 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_bb8,pcVar7);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_ab0.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_ab0.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create PathfinderDVL data file.");
          bVar3 = false;
          goto LAB_001ae997;
        }
      }
    }
    if ((bVar3) &&
       (local_c3c = local_c3c + 1, ExitOnErrorCount <= local_c3c && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001ae997:
      if (local_bc8 == 0) {
        clock_gettime(4,(timespec *)&local_c58);
        local_bf8 = local_c58.inf;
        dStack_bf0 = local_c58.sup;
        local_c58.inf =
             (double)(((long)local_c58.inf + (long)local_be8 +
                      ((long)local_c58.sup + (long)dStack_be0) / 1000000000) - local_c08.tv_sec);
        local_c58.sup =
             (double)(((long)local_c58.sup + (long)dStack_be0) % 1000000000 - local_c08.tv_nsec);
        if ((long)local_c58.sup < 0) {
          local_c58.inf = (double)((long)local_c58.inf + (long)local_c58.sup / 1000000000 + -1);
          local_c58.sup = (double)((long)local_c58.sup % 1000000000 + 1000000000);
        }
        local_be8 = local_c58.inf;
        dStack_be0 = local_c58.sup;
      }
      if ((FILE *)local_ab0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_ab0.pfSaveFile);
        local_ab0.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        DisconnectPathfinderDVL(&local_ab0);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE PathfinderDVLThread(void* pParam)
{
	PATHFINDERDVL pathfinderdvl;
	NMEADATA nmeadata;
	//double vrx = 0, vry = 0, vrz = 0, alt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&pathfinderdvl, 0, sizeof(PATHFINDERDVL));
	
	memset(&nmeadata, 0, sizeof(nmeadata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPausePathfinderDVL)
		{
			if (bConnected)
			{
				printf("PathfinderDVL paused.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartPathfinderDVL)
		{
			if (bConnected)
			{
				printf("Restarting a PathfinderDVL.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
			}
			bRestartPathfinderDVL = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectPathfinderDVL(&pathfinderdvl, "PathfinderDVL0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = pathfinderdvl.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (pathfinderdvl.pfSaveFile != NULL)
				{
					fclose(pathfinderdvl.pfSaveFile); 
					pathfinderdvl.pfSaveFile = NULL;
				}
				if ((pathfinderdvl.bSaveRawData)&&(pathfinderdvl.pfSaveFile == NULL)) 
				{
					if (strlen(pathfinderdvl.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", pathfinderdvl.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "pathfinderdvl");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					pathfinderdvl.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (pathfinderdvl.pfSaveFile == NULL) 
					{
						printf("Unable to create PathfinderDVL data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetNMEASentencePathfinderDVL(&pathfinderdvl, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				if (pathfinderdvl.bEnable_PD6_SA||pathfinderdvl.bEnable_PD6_TS||pathfinderdvl.bEnable_PD6_BI||pathfinderdvl.bEnable_PD6_BS||
					pathfinderdvl.bEnable_PD6_BE||pathfinderdvl.bEnable_PD6_BD)
				{
					if (pathfinderdvl.bEnable_PD6_SA)
					{
						psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
						theta_ahrs = -nmeadata.Pitch+interval(-theta_ahrs_acc, theta_ahrs_acc);
						phi_ahrs = nmeadata.Roll+interval(-phi_ahrs_acc, phi_ahrs_acc);
					}

					if (pathfinderdvl.bEnable_PD6_BS)
					{
						if (nmeadata.vstatus_ship == 'A')
						{
							vrx_dvl = nmeadata.vl_ship+interval(-dvl_acc, dvl_acc);
							vry_dvl = -nmeadata.vt_ship+interval(-dvl_acc, dvl_acc);
							vrz_dvl = nmeadata.vn_ship+interval(-dvl_acc, dvl_acc);
						}
						else if (nmeadata.vstatus_ship == 'V')
						{
							vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
						}
					}

					if (pathfinderdvl.bEnable_PD6_BE)
					{
						if (nmeadata.vstatus_earth == 'A')
						{
							sog = nmeadata.SOG;
							psi_dvl = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
						}
					}

					if (pathfinderdvl.bEnable_PD6_BD)
					{
						if (nmeadata.timesincelastgood < 4) altitude_AGL = nmeadata.Altitude_AGL;
					}
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a PathfinderDVL lost.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
				mSleep(threadperiod);
			}
		}

		//printf("PathfinderDVLThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (pathfinderdvl.pfSaveFile != NULL)
	{
		fclose(pathfinderdvl.pfSaveFile); 
		pathfinderdvl.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectPathfinderDVL(&pathfinderdvl);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}